

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O2

void __thiscall RSA::print_vocabulary(RSA *this)

{
  ostream *poVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Vocabulary",&local_31);
  Crypto::print_header(&this->super_Crypto,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&(this->super_Crypto).vocabulary);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void RSA::print_vocabulary() {
    print_header("Vocabulary");
    cout << vocabulary << endl;

}